

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall
Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
          (Solver *this,uchar op,vec<Minisat::Lit> *c,FILE *drup_file)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  Lit *pLVar4;
  undefined8 in_RCX;
  vec<Minisat::Lit> *in_RDX;
  uchar in_SIL;
  Solver *in_RDI;
  OnlineProofChecker *unaff_retaddr;
  int i;
  vec<Minisat::Lit> *in_stack_00000180;
  OnlineProofChecker *in_stack_00000188;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int index;
  undefined7 in_stack_fffffffffffffff0;
  
  puVar1 = in_RDI->buf_ptr;
  in_RDI->buf_ptr = puVar1 + 1;
  *puVar1 = in_SIL;
  in_RDI->buf_len = in_RDI->buf_len + 1;
  if (in_RDI->onlineDratChecker != (OnlineProofChecker *)0x0) {
    if (in_SIL == 'a') {
      bVar2 = OnlineProofChecker::addClause<Minisat::vec<Minisat::Lit>>
                        (unaff_retaddr,(vec<Minisat::Lit> *)in_RDI,
                         (Lit *)CONCAT17(0x61,in_stack_fffffffffffffff0),
                         SUB81((ulong)in_RDX >> 0x38,0));
      if (!bVar2) {
        exit(0x86);
      }
    }
    else {
      bVar2 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
                        (in_stack_00000188,in_stack_00000180);
      if (!bVar2) {
        exit(0x86);
      }
    }
  }
  iVar5 = 0;
  while (index = iVar5, iVar3 = vec<Minisat::Lit>::size(in_RDX), iVar5 < iVar3) {
    pLVar4 = vec<Minisat::Lit>::operator[](in_RDX,index);
    byteDRUP((Solver *)CONCAT44(index,pLVar4->x),(Lit)(int)((ulong)in_RCX >> 0x20));
    iVar5 = index + 1;
  }
  puVar1 = in_RDI->buf_ptr;
  in_RDI->buf_ptr = puVar1 + 1;
  *puVar1 = '\0';
  in_RDI->buf_len = in_RDI->buf_len + 1;
  if (0x100000 < in_RDI->buf_len) {
    binDRUP_flush(in_RDI,(FILE *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

inline void binDRUP(unsigned char op, const V &c, FILE *drup_file)
    {
        assert(op == 'a' || op == 'd');
        *buf_ptr++ = op;
        buf_len++;
        if (onlineDratChecker) {
            if (op == 'a') {
                TRACE(if (!checkOnlineCheckerState(c)) {
                    std::cout << "c failed to validate online checker state" << std::endl;
                });

                if (!onlineDratChecker->addClause(c, lit_Undef)) {
                    exit(134);
                }
            } else {
                if (!onlineDratChecker->removeClause(c)) exit(134);
            }
        }
        for (int i = 0; i < c.size(); i++) byteDRUP(c[i]);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }